

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall Validate::PrintSuccessMessage(Validate *this)

{
  fprintf(_stderr,"INFO: All %s file validation checks have passed.",this->fileDescription_);
  if (this->warnings_ == true) {
    fwrite(" Please take note of any warnings.",0x22,1,_stderr);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void Validate::PrintSuccessMessage() {
/* Only print message regarding warnings if relevant. Some validation checks do
 * not produce any warning messages. */

  fprintf(stderr, "INFO: All %s file validation checks have passed.",
	  fileDescription_);
  if (warnings_) {
    fprintf(stderr, " Please take note of any warnings.");
  }
  fprintf(stderr, "\n");

}